

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O2

bool __thiscall CProfileNode::Return(CProfileNode *this)

{
  int iVar1;
  unsigned_long uVar2;
  
  iVar1 = this->RecursionCounter + -1;
  this->RecursionCounter = iVar1;
  if ((iVar1 == 0) && (this->TotalCalls != 0)) {
    uVar2 = btClock::getTimeMicroseconds(&gProfileClock);
    this->TotalTime = (float)(uVar2 - this->StartTime) / 1000.0 + this->TotalTime;
    iVar1 = this->RecursionCounter;
  }
  return iVar1 == 0;
}

Assistant:

bool	CProfileNode::Return( void )
{
	if ( --RecursionCounter == 0 && TotalCalls != 0 ) {
		unsigned long int time;
		Profile_Get_Ticks(&time);
		time-=StartTime;
		TotalTime += (float)time / Profile_Get_Tick_Rate();
	}
	return ( RecursionCounter == 0 );
}